

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O3

void Cnf_CollectLeaves_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper,int fStopCompl)

{
  size_t __size;
  int iVar1;
  void **ppvVar2;
  long lVar3;
  
  do {
    if (pObj != pRoot) {
      if ((*(ulong *)&pObj->field_0x18 & 0x10) != 0) {
        if (fStopCompl == 0) {
          pObj = (Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
        }
LAB_00505ae6:
        iVar1 = vSuper->nSize;
        if (0 < (long)iVar1) {
          lVar3 = 0;
          do {
            if ((Aig_Obj_t *)vSuper->pArray[lVar3] == pObj) {
              return;
            }
            lVar3 = lVar3 + 1;
          } while (iVar1 != lVar3);
        }
        if (iVar1 == vSuper->nCap) {
          if (iVar1 < 0x10) {
            if (vSuper->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(0x80);
            }
            else {
              ppvVar2 = (void **)realloc(vSuper->pArray,0x80);
            }
            vSuper->pArray = ppvVar2;
            vSuper->nCap = 0x10;
          }
          else {
            __size = (ulong)(uint)(iVar1 * 2) * 8;
            if (vSuper->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(__size);
            }
            else {
              ppvVar2 = (void **)realloc(vSuper->pArray,__size);
            }
            vSuper->pArray = ppvVar2;
            vSuper->nCap = iVar1 * 2;
          }
        }
        else {
          ppvVar2 = vSuper->pArray;
        }
        iVar1 = vSuper->nSize;
        vSuper->nSize = iVar1 + 1;
        ppvVar2[iVar1] = pObj;
        return;
      }
      if ((fStopCompl != 0) && (((ulong)pObj & 1) != 0)) goto LAB_00505ae6;
    }
    if (((uint)*(ulong *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                    ,0x34,"void Cnf_CollectLeaves_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, int)");
    }
    if (fStopCompl == 0) {
      Cnf_CollectLeaves_rec(pRoot,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSuper,0)
      ;
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    }
    else {
      Cnf_CollectLeaves_rec(pRoot,pObj->pFanin0,vSuper,1);
      pObj = pObj->pFanin1;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Detects multi-input gate rooted at this node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_CollectLeaves_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper, int fStopCompl )
{
    if ( pRoot != pObj && (pObj->fMarkA || (fStopCompl && Aig_IsComplement(pObj))) )
    {
        Vec_PtrPushUnique( vSuper, fStopCompl ? pObj : Aig_Regular(pObj) );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( fStopCompl )
    {
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjChild0(pObj), vSuper, 1 );
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjChild1(pObj), vSuper, 1 );
    }
    else
    {
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjFanin0(pObj), vSuper, 0 );
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjFanin1(pObj), vSuper, 0 );
    }
}